

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
::grow(SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
       *this,size_t MinSize)

{
  long *plVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint64_t uVar4;
  DWARFDebugInfoEntry *pDVar5;
  ulong uVar6;
  void *pvVar7;
  size_type __n;
  DWARFDebugInfoEntry *pDVar8;
  uint64_t *puVar9;
  ulong uVar10;
  long lVar11;
  uint64_t *extraout_RDX;
  new_allocator<llvm::DWARFDebugInfoEntry> *this_00;
  long lVar12;
  DWARFDebugInfoEntry *pDVar13;
  SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  *__ptr;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar6 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                 ).super_SmallVectorBase.Capacity + 2;
  uVar10 = uVar6 >> 1 | uVar6;
  uVar10 = uVar10 >> 2 | uVar10;
  uVar10 = uVar10 >> 4 | uVar10;
  uVar10 = uVar10 >> 8 | uVar10;
  uVar6 = (uVar6 >> 0x20 | uVar10 >> 0x10 | uVar10) + 1;
  if (uVar6 <= MinSize) {
    uVar6 = MinSize;
  }
  if (0xfffffffe < uVar6) {
    uVar6 = 0xffffffff;
  }
  this_00 = (new_allocator<llvm::DWARFDebugInfoEntry> *)(uVar6 * 8);
  pvVar7 = malloc((size_t)this_00);
  if (pvVar7 == (void *)0x0) {
    SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>,false>
    ::grow();
    __n = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
          _M_check_len((vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                        *)this_00,1,"vector::_M_realloc_insert");
    puVar2 = *(uint64_t **)this_00;
    puVar3 = *(uint64_t **)(this_00 + 8);
    lVar12 = (long)(MinSize - (long)puVar2) >> 3;
    if (__n == 0) {
      pDVar8 = (DWARFDebugInfoEntry *)0x0;
    }
    else {
      pDVar8 = __gnu_cxx::new_allocator<llvm::DWARFDebugInfoEntry>::allocate
                         (this_00,__n,(void *)0x0);
    }
    (&pDVar8->AbbrevDecl)[lVar12] = (DWARFAbbreviationDeclaration *)extraout_RDX[2];
    uVar4 = extraout_RDX[1];
    (&pDVar8->Offset)[lVar12] = *extraout_RDX;
    (&pDVar8->Offset + lVar12)[1] = uVar4;
    pDVar13 = pDVar8;
    for (puVar9 = puVar2; puVar9 != (uint64_t *)MinSize; puVar9 = puVar9 + 3) {
      pDVar13->AbbrevDecl = (DWARFAbbreviationDeclaration *)puVar9[2];
      uVar4 = puVar9[1];
      pDVar13->Offset = *puVar9;
      *(uint64_t *)&pDVar13->Depth = uVar4;
      pDVar13 = pDVar13 + 1;
    }
    for (; pDVar5 = pDVar13 + 1, puVar3 != (uint64_t *)MinSize; MinSize = MinSize + 0x18) {
      pDVar13[1].AbbrevDecl = *(DWARFAbbreviationDeclaration **)(MinSize + 0x10);
      uVar4 = *(uint64_t *)(MinSize + 8);
      pDVar5->Offset = *(uint64_t *)MinSize;
      *(uint64_t *)&pDVar13[1].Depth = uVar4;
      pDVar13 = pDVar5;
    }
    if (puVar2 != (uint64_t *)0x0) {
      operator_delete(puVar2,*(long *)(this_00 + 0x10) - (long)puVar2);
    }
    *(DWARFDebugInfoEntry **)this_00 = pDVar8;
    *(DWARFDebugInfoEntry **)(this_00 + 8) = pDVar5;
    *(DWARFDebugInfoEntry **)(this_00 + 0x10) = pDVar8 + __n;
    return;
  }
  __ptr = (SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
           *)(this->
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             ).super_SmallVectorBase.BeginX;
  uVar10 = (ulong)(this->
                  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                  ).super_SmallVectorBase.Size;
  if (uVar10 != 0) {
    lVar12 = uVar10 * 8;
    lVar11 = 0;
    do {
      *(undefined8 *)((long)pvVar7 + lVar11) =
           *(undefined8 *)
            ((long)&(__ptr->
                    super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                    ).super_SmallVectorBase.BeginX + lVar11);
      *(undefined8 *)
       ((long)&(__ptr->
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               ).super_SmallVectorBase.BeginX + lVar11) = 0;
      lVar11 = lVar11 + 8;
    } while (lVar12 - lVar11 != 0);
    __ptr = (SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             *)(this->
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               ).super_SmallVectorBase.BeginX;
    if (uVar10 != 0) {
      do {
        plVar1 = *(long **)((long)__ptr + lVar12 + -8);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
        *(undefined8 *)((long)__ptr + lVar12 + -8) = 0;
        lVar12 = lVar12 + -8;
      } while (lVar12 != 0);
      __ptr = (SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               *)(this->
                 super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                 ).super_SmallVectorBase.BeginX;
    }
  }
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  ).super_SmallVectorBase.BeginX = pvVar7;
  (this->
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  ).super_SmallVectorBase.Capacity = (uint)uVar6;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}